

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O2

FT_Error bsdf_raster_new(FT_Memory memory,BSDF_PRaster *araster)

{
  BSDF_PRaster pBVar1;
  FT_Error error;
  
  pBVar1 = (BSDF_PRaster)ft_mem_alloc(memory,8,&error);
  if (error == 0) {
    pBVar1->memory = memory;
  }
  *araster = pBVar1;
  return error;
}

Assistant:

static FT_Error
  bsdf_raster_new( FT_Memory      memory,
                   BSDF_PRaster*  araster )
  {
    FT_Error      error;
    BSDF_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

    return error;
  }